

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O2

void __thiscall Perseus::BackupStageLeadOut(Perseus *this,GaoVectorSet *Gao)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  _func_int *p_Var2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar6 = 0;
  while( true ) {
    lVar4 = *(long *)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
    if (lVar4 == 0) {
      lVar4 = *(long *)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
    }
    uVar3 = (**(code **)(**(long **)(lVar4 + 0x30) + 0x68))();
    if (uVar3 == uVar6) break;
    uVar5 = 0;
    while( true ) {
      lVar4 = *(long *)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
      if (lVar4 == 0) {
        lVar4 = *(long *)((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
      }
      uVar3 = (**(code **)(**(long **)(lVar4 + 0x30) + 200))();
      if (uVar3 == uVar5) break;
      pmVar1 = (Gao->
               super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
               ).
               super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
               .base_[(Gao->
                      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                      ).
                      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                      .origin_offset_ +
                      (Gao->
                      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                      ).
                      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                      .stride_list_.elems[0] * (ulong)uVar6 +
                      (Gao->
                      super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                      ).
                      super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                      .stride_list_.elems[1] * (ulong)uVar5];
      if (pmVar1 != (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)0x0) {
        boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                  (&pmVar1->data_);
      }
      operator_delete(pmVar1,0x28);
      uVar5 = uVar5 + 1;
    }
    uVar6 = uVar6 + 1;
  }
  p_Var2 = this->_vptr_Perseus[-3];
  std::__cxx11::string::string((string *)&local_50,(string *)&this->_m_identification);
  std::operator+(&local_70,&local_50,"BackupStage");
  TimedAlgorithm::StopTimer((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var2),&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Perseus::BackupStageLeadOut(GaoVectorSet Gao) const
{
    // release the memory of the back-projected vectors
    for(unsigned int a=0;a!=GetPU()->GetNrJointActions();a++)
        for(unsigned int o=0;o!=GetPU()->GetNrJointObservations();o++)
            delete(Gao[a][o]);
    
    StopTimer(GetIdentification() + "BackupStage");
}